

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EBMultiFabUtil.cpp
# Opt level: O3

void amrex::EB_average_face_to_cellcenter(MultiFab *ccmf,int dcomp,Array<const_MultiFab_*,_3> *fmf)

{
  double dVar1;
  _Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false> _Var2;
  EBCellFlagFab *this;
  int iVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  Array<const_MultiFab_*,_3> *pAVar8;
  FabType FVar9;
  uint uVar10;
  long lVar11;
  int *piVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  int iVar17;
  int iVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  int iVar28;
  long lVar29;
  long lVar30;
  long lVar31;
  int iVar32;
  long lVar33;
  long lVar34;
  void *__s;
  bool bVar35;
  double dVar36;
  MFIter mfi;
  long local_3b0;
  Box local_36c;
  FabArray<amrex::FArrayBox> *local_350;
  long local_348;
  ulong local_340;
  long local_338;
  long local_330;
  long local_328;
  long local_320;
  long local_318;
  long local_310;
  long local_308;
  long local_300;
  long local_2f8;
  ulong local_2f0;
  int local_2e8;
  int local_2e4;
  Array<const_MultiFab_*,_3> *local_2e0;
  long local_2d8;
  long local_2d0;
  Array4<double> local_2c8;
  FabArray<amrex::EBCellFlagFab> *local_288;
  long local_280;
  long local_278;
  long local_270;
  ulong local_268;
  EBCellFlag *local_260;
  long local_258;
  long local_250;
  long local_248;
  Array4<const_double> local_240;
  Array4<const_double> local_200;
  Array4<const_double> local_1c0;
  MultiCutFab *local_180;
  MultiCutFab *local_178;
  MultiCutFab *local_170;
  MFIter local_168;
  Array4<const_double> local_108;
  Array4<const_double> local_c8;
  Array4<const_double> local_88;
  MFItInfo local_44;
  
  _Var2._M_head_impl =
       (fmf->_M_elems[0]->super_FabArray<amrex::FArrayBox>).m_factory._M_t.
       super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
       .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl;
  local_350 = &ccmf->super_FabArray<amrex::FArrayBox>;
  local_2e0 = fmf;
  if ((_Var2._M_head_impl != (FabFactory<amrex::FArrayBox> *)0x0) &&
     (lVar11 = __dynamic_cast(_Var2._M_head_impl,&FabFactory<amrex::FArrayBox>::typeinfo,
                              &EBFArrayBoxFactory::typeinfo), lVar11 != 0)) {
    local_288 = EBDataCollection::getMultiEBCellFlagFab(*(EBDataCollection **)(lVar11 + 0xd8));
    EBDataCollection::getAreaFrac(*(EBDataCollection **)(lVar11 + 0xd8));
    local_44.num_streams = Gpu::Device::max_gpu_streams;
    local_44.do_tiling = true;
    local_44.tilesize.vect[0] = (int)FabArrayBase::mfiter_tile_size;
    local_44.tilesize.vect[1] = FabArrayBase::mfiter_tile_size._4_4_;
    local_44.tilesize.vect[2] = DAT_00717ec0;
    local_44.dynamic = true;
    local_44.device_sync = true;
    MFIter::MFIter(&local_168,&local_350->super_FabArrayBase,&local_44);
    if (local_168.currentIndex < local_168.endIndex) {
      local_328 = (long)dcomp << 3;
      local_2d0 = (long)(dcomp + 1) << 3;
      local_2d8 = (long)(dcomp + 2) << 3;
      do {
        MFIter::tilebox(&local_36c,&local_168);
        piVar12 = &local_168.currentIndex;
        if (local_168.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
          piVar12 = ((local_168.local_index_map)->super_vector<int,_std::allocator<int>_>).
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start + local_168.currentIndex;
        }
        this = (local_288->m_fabs_v).
               super__Vector_base<amrex::EBCellFlagFab_*,_std::allocator<amrex::EBCellFlagFab_*>_>.
               _M_impl.super__Vector_impl_data._M_start[*piVar12];
        FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>(&local_2c8,local_350,&local_168);
        pAVar8 = local_2e0;
        FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  (&local_1c0,&local_2e0->_M_elems[0]->super_FabArray<amrex::FArrayBox>,&local_168);
        FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  (&local_200,&pAVar8->_M_elems[1]->super_FabArray<amrex::FArrayBox>,&local_168);
        FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  (&local_240,&pAVar8->_M_elems[2]->super_FabArray<amrex::FArrayBox>,&local_168);
        FVar9 = EBCellFlagFab::getType(this,&local_36c);
        iVar7 = local_36c.bigend.vect[2];
        iVar6 = local_36c.bigend.vect[1];
        iVar5 = local_36c.bigend.vect[0];
        iVar28 = local_36c.smallend.vect[1];
        iVar18 = local_36c.smallend.vect[0];
        if (FVar9 == regular) {
          if (local_36c.smallend.vect[2] <= local_36c.bigend.vect[2]) {
            local_340 = (ulong)(uint)local_36c.bigend.vect[1];
            local_348 = (long)local_36c.smallend.vect[0] * 8;
            local_338 = CONCAT44(local_338._4_4_,local_36c.bigend.vect[2] + 1);
            iVar18 = local_36c.smallend.vect[2];
            do {
              if (local_36c.smallend.vect[1] <= local_36c.bigend.vect[1]) {
                lVar33 = (long)local_2c8.begin.x;
                local_330 = CONCAT44(local_330._4_4_,iVar18 + 1);
                lVar25 = (iVar18 - local_2c8.begin.z) * local_2c8.kstride;
                local_2f0 = (long)local_2c8.p +
                            local_2d0 * local_2c8.nstride + lVar25 * 8 + lVar33 * -8 + local_348;
                local_2f8 = (long)local_2c8.p +
                            local_2c8.nstride * local_2d8 + lVar25 * 8 + lVar33 * -8 + local_348;
                lVar11 = (iVar18 - local_200.begin.z) * local_200.kstride * 8 +
                         (long)local_200.begin.x * -8 + local_348;
                local_318 = (long)local_240.begin.y;
                local_310 = (long)local_240.p +
                            (long)((iVar18 + 1) - local_240.begin.z) * local_240.kstride * 8 +
                            (long)local_240.begin.x * -8 + local_348;
                local_308 = (long)local_240.p +
                            local_240.kstride * 8 * (long)(iVar18 - local_240.begin.z) +
                            (long)local_240.begin.x * -8 + local_348;
                local_300 = local_200.jstride * 8;
                local_320 = local_240.jstride * 8;
                lVar31 = (long)local_36c.smallend.vect[1];
                do {
                  iVar28 = (int)lVar31;
                  if (local_36c.smallend.vect[0] <= local_36c.bigend.vect[0]) {
                    lVar4 = (lVar31 - local_1c0.begin.y) * local_1c0.jstride * 8 +
                            (iVar18 - local_1c0.begin.z) * local_1c0.kstride * 8 +
                            (long)local_1c0.begin.x * -8 + local_348;
                    lVar16 = (lVar31 - local_2c8.begin.y) * local_2c8.jstride * 8;
                    lVar14 = (lVar31 - local_318) * local_320;
                    lVar15 = 0;
                    do {
                      *(double *)
                       ((long)local_2c8.p +
                       lVar15 * 8 +
                       lVar16 + local_328 * local_2c8.nstride + lVar25 * 8 + lVar33 * -8 + local_348
                       ) = (*(double *)((long)local_1c0.p + lVar15 * 8 + lVar4) +
                           *(double *)((long)local_1c0.p + lVar15 * 8 + lVar4 + 8)) * 0.5;
                      *(double *)(local_2f0 + lVar16 + lVar15 * 8) =
                           (*(double *)
                             ((long)local_200.p +
                             lVar15 * 8 + (lVar31 - local_200.begin.y) * local_300 + lVar11) +
                           *(double *)
                            ((long)local_200.p +
                            lVar15 * 8 + ((iVar28 + 1) - local_200.begin.y) * local_300 + lVar11)) *
                           0.5;
                      *(double *)(lVar16 + local_2f8 + lVar15 * 8) =
                           (*(double *)(lVar14 + local_308 + lVar15 * 8) +
                           *(double *)(local_310 + lVar14 + lVar15 * 8)) * 0.5;
                      lVar15 = lVar15 + 1;
                    } while ((local_36c.bigend.vect[0] - local_36c.smallend.vect[0]) + 1 !=
                             (int)lVar15);
                  }
                  lVar31 = lVar31 + 1;
                } while (iVar28 + 1 != local_36c.bigend.vect[1] + 1U);
              }
              iVar18 = iVar18 + 1;
            } while (iVar18 != local_36c.bigend.vect[2] + 1);
          }
        }
        else if (FVar9 == covered) {
          if (local_36c.smallend.vect[2] <= local_36c.bigend.vect[2]) {
            lVar11 = (long)local_36c.smallend.vect[1];
            lVar31 = (long)local_36c.smallend.vect[0];
            uVar10 = local_36c.bigend.vect[0] - local_36c.smallend.vect[0];
            iVar17 = local_36c.bigend.vect[1] - local_36c.smallend.vect[1];
            iVar3 = local_36c.smallend.vect[2];
            do {
              if (iVar28 <= iVar6) {
                lVar25 = local_2c8.jstride * 8;
                __s = (void *)((long)local_2c8.p +
                              local_2c8.nstride * local_328 + (lVar11 - local_2c8.begin.y) * lVar25
                              + (iVar3 - local_2c8.begin.z) * local_2c8.kstride * 8 +
                              (long)local_2c8.begin.x * -8 + lVar31 * 8);
                iVar32 = iVar17 + 1;
                do {
                  if (iVar18 <= iVar5) {
                    memset(__s,0,(ulong)uVar10 * 8 + 8);
                  }
                  __s = (void *)((long)__s + lVar25);
                  iVar32 = iVar32 + -1;
                } while (iVar32 != 0);
              }
              bVar35 = iVar3 != iVar7;
              iVar3 = iVar3 + 1;
            } while (bVar35);
          }
        }
        else {
          MultiCutFab::const_array(&local_88,local_180,&local_168);
          MultiCutFab::const_array(&local_c8,local_178,&local_168);
          MultiCutFab::const_array(&local_108,local_170,&local_168);
          local_3b0 = (long)local_36c.smallend.vect[2];
          if (local_36c.smallend.vect[2] <= local_36c.bigend.vect[2]) {
            iVar18 = (this->super_BaseFab<amrex::EBCellFlag>).domain.smallend.vect[0];
            iVar28 = (this->super_BaseFab<amrex::EBCellFlag>).domain.smallend.vect[1];
            local_340 = (ulong)(((this->super_BaseFab<amrex::EBCellFlag>).domain.bigend.vect[0] -
                                iVar18) + 1);
            local_268 = (ulong)(uint)local_36c.bigend.vect[1];
            local_248 = (long)local_36c.smallend.vect[1];
            local_250 = (long)local_36c.smallend.vect[0];
            local_280 = (long)(this->super_BaseFab<amrex::EBCellFlag>).domain.smallend.vect[2];
            local_2e4 = local_36c.bigend.vect[1] + 1;
            local_258 = local_250 * 8;
            local_2e8 = local_36c.smallend.vect[0] + 1;
            local_260 = (this->super_BaseFab<amrex::EBCellFlag>).dptr + (local_250 - iVar18);
            local_270 = (long)iVar28 * -4;
            local_278 = (long)(((this->super_BaseFab<amrex::EBCellFlag>).domain.bigend.vect[1] -
                               iVar28) + 1) * 4;
            local_348 = CONCAT44(local_348._4_4_,local_36c.bigend.vect[0]);
            do {
              if (local_36c.smallend.vect[1] <= local_36c.bigend.vect[1]) {
                local_338 = (local_3b0 - local_280) * local_278 + local_270;
                local_330 = local_3b0 + 1;
                lVar11 = local_248;
                do {
                  lVar31 = local_3b0 + 1;
                  if (local_36c.bigend.vect[0] < local_36c.smallend.vect[0]) {
                    uVar13 = lVar11 + 1U & 0xffffffff;
                  }
                  else {
                    lVar19 = (lVar11 - local_1c0.begin.y) * local_1c0.jstride;
                    lVar29 = (local_3b0 - local_1c0.begin.z) * local_1c0.kstride;
                    uVar13 = lVar11 + 1;
                    local_300 = lVar11 - local_200.begin.y;
                    local_308 = uVar13 - (long)local_200.begin.y;
                    iVar28 = (int)uVar13 - local_200.begin.y;
                    local_310 = CONCAT44(local_310._4_4_,iVar28);
                    local_318 = lVar31 - local_240.begin.z;
                    iVar18 = (int)lVar31 - local_240.begin.z;
                    local_320 = CONCAT44(local_320._4_4_,iVar18);
                    lVar25 = (lVar11 - local_2c8.begin.y) * local_2c8.jstride * 8 +
                             (local_3b0 - local_2c8.begin.z) * local_2c8.kstride * 8;
                    lVar20 = (lVar11 - local_88.begin.y) * local_88.jstride;
                    lVar27 = (local_3b0 - local_88.begin.z) * local_88.kstride;
                    lVar26 = (local_3b0 - local_c8.begin.z) * local_c8.kstride;
                    lVar30 = (lVar11 - local_108.begin.y) * local_108.jstride;
                    lVar14 = (long)local_2c8.begin.x;
                    lVar33 = local_2d0 * local_2c8.nstride + lVar25 + lVar14 * -8 + local_258;
                    lVar4 = local_328 * local_2c8.nstride + lVar25 + lVar14 * -8 + local_258;
                    lVar25 = local_2c8.nstride * local_2d8 + lVar25 + lVar14 * -8 + local_258;
                    lVar21 = local_240.kstride * 8;
                    lVar34 = (lVar11 - local_240.begin.y) * local_240.jstride;
                    lVar15 = (long)local_240.begin.x;
                    lVar14 = (local_3b0 - local_240.begin.z) * lVar21 + lVar34 * 8 + lVar15 * -8 +
                             local_258;
                    lVar22 = local_200.jstride * 8;
                    lVar16 = (local_3b0 - local_200.begin.z) * local_200.kstride;
                    lVar23 = (long)local_200.begin.x;
                    lVar24 = 0;
                    do {
                      if ((~*(uint32_t *)
                             ((long)&local_260[lVar24].flag + (local_338 + lVar11 * 4) * local_340)
                          & 3) == 0) {
                        *(undefined8 *)((long)local_2c8.p + lVar24 * 8 + lVar4) = 0;
                        *(undefined8 *)((long)local_2c8.p + lVar24 * 8 + lVar33) = 0;
                        *(undefined8 *)((long)local_2c8.p + lVar24 * 8 + lVar25) = 0;
                      }
                      else {
                        if ((local_88.p
                             [local_250 + ((lVar20 + lVar27 + lVar24) - (long)local_88.begin.x)] !=
                             0.0) || (NAN(local_88.p
                                          [local_250 +
                                           ((lVar20 + lVar27 + lVar24) - (long)local_88.begin.x)])))
                        {
                          dVar36 = local_1c0.p
                                   [local_250 +
                                    ((lVar19 + lVar29 + lVar24) - (long)local_1c0.begin.x)];
                          if ((local_88.p
                               [local_250 +
                                ((lVar20 + lVar27 + lVar24 + 1) - (long)local_88.begin.x)] != 0.0)
                             || (NAN(local_88.p
                                     [local_250 +
                                      ((lVar20 + lVar27 + lVar24 + 1) - (long)local_88.begin.x)])))
                          {
                            dVar36 = (dVar36 + local_1c0.p
                                               [local_250 +
                                                ((lVar19 + lVar29 + lVar24 + 1) -
                                                (long)local_1c0.begin.x)]) * 0.5;
                          }
                        }
                        else {
                          dVar36 = local_1c0.p
                                   [lVar19 + lVar29 + ((local_2e8 - local_1c0.begin.x) + (int)lVar24
                                                      )];
                        }
                        *(double *)((long)local_2c8.p + lVar24 * 8 + lVar4) = dVar36;
                        dVar36 = *(double *)
                                  ((long)local_c8.p +
                                  lVar24 * 8 +
                                  lVar26 * 8 + (lVar11 - local_c8.begin.y) * local_c8.jstride * 8 +
                                  (long)local_c8.begin.x * -8 + local_258);
                        if ((dVar36 != 0.0) || (NAN(dVar36))) {
                          dVar1 = *(double *)
                                   ((long)local_c8.p +
                                   lVar24 * 8 +
                                   local_c8.jstride * 8 * (uVar13 - (long)local_c8.begin.y) +
                                   lVar26 * 8 + (long)local_c8.begin.x * -8 + local_258);
                          dVar36 = *(double *)
                                    ((long)local_200.p +
                                    lVar24 * 8 +
                                    local_300 * lVar22 + lVar16 * 8 + lVar23 * -8 + local_258);
                          if ((dVar1 != 0.0) || (NAN(dVar1))) {
                            dVar36 = (dVar36 + *(double *)
                                                ((long)local_200.p +
                                                lVar24 * 8 +
                                                local_308 * lVar22 + lVar16 * 8 + lVar23 * -8 +
                                                local_258)) * 0.5;
                          }
                        }
                        else {
                          dVar36 = *(double *)
                                    ((long)local_200.p +
                                    lVar24 * 8 +
                                    lVar22 * iVar28 + lVar16 * 8 + lVar23 * -8 + local_258);
                        }
                        *(double *)((long)local_2c8.p + lVar24 * 8 + lVar33) = dVar36;
                        dVar36 = *(double *)
                                  ((long)local_108.p +
                                  lVar24 * 8 +
                                  local_108.kstride * 8 * (local_3b0 - local_108.begin.z) +
                                  lVar30 * 8 + (long)local_108.begin.x * -8 + local_258);
                        if ((dVar36 != 0.0) || (NAN(dVar36))) {
                          dVar36 = *(double *)
                                    ((long)local_108.p +
                                    lVar24 * 8 +
                                    (lVar31 - local_108.begin.z) * local_108.kstride * 8 +
                                    lVar30 * 8 + (long)local_108.begin.x * -8 + local_258);
                          if ((dVar36 != 0.0) || (NAN(dVar36))) {
                            dVar36 = (*(double *)((long)local_240.p + lVar24 * 8 + lVar14) +
                                     *(double *)
                                      ((long)local_240.p +
                                      lVar24 * 8 +
                                      local_318 * lVar21 + lVar34 * 8 + lVar15 * -8 + local_258)) *
                                     0.5;
                          }
                          else {
                            dVar36 = *(double *)((long)local_240.p + lVar24 * 8 + lVar14);
                          }
                        }
                        else {
                          dVar36 = *(double *)
                                    ((long)local_240.p +
                                    lVar24 * 8 +
                                    lVar21 * iVar18 + lVar34 * 8 + lVar15 * -8 + local_258);
                        }
                        *(double *)((long)local_2c8.p + lVar24 * 8 + lVar25) = dVar36;
                      }
                      lVar24 = lVar24 + 1;
                      local_2f8 = lVar11;
                      local_2f0 = uVar13;
                    } while ((local_36c.bigend.vect[0] - local_36c.smallend.vect[0]) + 1 !=
                             (int)lVar24);
                  }
                  lVar11 = lVar11 + 1;
                } while ((int)uVar13 != local_2e4);
              }
              local_3b0 = local_3b0 + 1;
            } while (local_36c.bigend.vect[2] + 1 != (int)local_3b0);
          }
        }
        MFIter::operator++(&local_168);
      } while (local_168.currentIndex < local_168.endIndex);
    }
    MFIter::~MFIter(&local_168);
    return;
  }
  average_face_to_cellcenter((MultiFab *)local_350,dcomp,local_2e0,0);
  return;
}

Assistant:

void
EB_average_face_to_cellcenter (MultiFab& ccmf, int dcomp,
                               const Array<MultiFab const*,AMREX_SPACEDIM>& fmf)
{
    AMREX_ASSERT(ccmf.nComp() >= dcomp + AMREX_SPACEDIM);

    if (!fmf[0]->hasEBFabFactory())
    {
        average_face_to_cellcenter(ccmf, dcomp, fmf);
    }
    else
    {
        const auto& factory = dynamic_cast<EBFArrayBoxFactory const&>(fmf[0]->Factory());
        const auto& flags = factory.getMultiEBCellFlagFab();
        const auto& area = factory.getAreaFrac();

        MFItInfo info;
        if (Gpu::notInLaunchRegion()) info.EnableTiling().SetDynamic(true);
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
        for (MFIter mfi(ccmf,info); mfi.isValid(); ++mfi)
        {
            const Box& bx = mfi.tilebox();
            const auto& flagfab = flags[mfi];
            Array4<Real> const& ccfab = ccmf.array(mfi);
            AMREX_D_TERM(Array4<Real const> const& xfab = fmf[0]->const_array(mfi);,
                         Array4<Real const> const& yfab = fmf[1]->const_array(mfi);,
                         Array4<Real const> const& zfab = fmf[2]->const_array(mfi));
            const auto fabtyp = flagfab.getType(bx);
            if (fabtyp == FabType::covered) {
                AMREX_HOST_DEVICE_FOR_3D(bx, i, j, k,
                {
                    ccfab(i,j,k,dcomp) = 0.0;
                });
            } else if (fabtyp == FabType::regular) {
                AMREX_HOST_DEVICE_PARALLEL_FOR_3D(bx, i, j, k,
                {
                    amrex_avg_fc_to_cc(i,j,k,ccfab,AMREX_D_DECL(xfab,yfab,zfab),dcomp);
                });
            } else {
                AMREX_D_TERM(Array4<Real const> const& apx = area[0]->const_array(mfi);,
                             Array4<Real const> const& apy = area[1]->const_array(mfi);,
                             Array4<Real const> const& apz = area[2]->const_array(mfi));
                Array4<EBCellFlag const> const& flagarr = flagfab.const_array();
                AMREX_HOST_DEVICE_FOR_3D(bx,i,j,k,
                {
                    eb_avg_fc_to_cc(i,j,k,dcomp,ccfab,AMREX_D_DECL(xfab,yfab,zfab),
                                    AMREX_D_DECL(apx,apy,apz),flagarr);
                });
            }
        }
    }
}